

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int stbi_is_hdr(char *filename)

{
  FILE *__stream;
  int local_1c;
  int result;
  FILE *f;
  char *filename_local;
  
  __stream = fopen(filename,"rb");
  local_1c = 0;
  if (__stream != (FILE *)0x0) {
    local_1c = stbi_is_hdr_from_file((FILE *)__stream);
    fclose(__stream);
  }
  return local_1c;
}

Assistant:

extern int      stbi_is_hdr          (char const *filename)
{
   FILE *f = fopen(filename, "rb");
   int result=0;
   if (f) {
      result = stbi_is_hdr_from_file(f);
      fclose(f);
   }
   return result;
}